

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::LinkedModel::MergePartialFromCodedStream
          (LinkedModel *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  int byte_limit;
  LinkedModelFile *this_00;
  pair<int,_int> pVar6;
  uint tag;
  ulong uVar7;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002aa96c;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002aa96c:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    tag = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\n' || (tag & 0xfffffff8) != 8)) {
      if (tag == 0) {
        return true;
      }
      if ((tag & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
    }
    else {
      if (this->_oneof_case_[0] == 1) {
        this_00 = (this->LinkType_).linkedmodelfile_;
      }
      else {
        this->_oneof_case_[0] = 1;
        this_00 = (LinkedModelFile *)operator_new(0x28);
        LinkedModelFile::LinkedModelFile(this_00);
        (this->LinkType_).linkedmodelfile_ = this_00;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar6 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,byte_limit);
      if ((long)pVar6 < 0) {
        return false;
      }
      bVar4 = LinkedModelFile::MergePartialFromCodedStream(this_00,input);
      if (!bVar4) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar6.first);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool LinkedModel::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LinkedModel)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.LinkedModelFile linkedModelFile = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_linkedmodelfile()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LinkedModel)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LinkedModel)
  return false;
#undef DO_
}